

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O1

bool __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
::FreeAllocation(EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
                 *this,void *address)

{
  EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
  *pEVar1;
  TEmitBufferAllocation *pTVar2;
  TEmitBufferAllocation *buffer;
  bool bVar3;
  
  CCLock::Enter(&(this->criticalSection).super_CCLock);
  buffer = this->allocations;
  bVar3 = buffer != (TEmitBufferAllocation *)0x0;
  if (bVar3) {
    if (buffer->allocation->address == (char *)address) {
      pTVar2 = (TEmitBufferAllocation *)0x0;
    }
    else {
      do {
        pTVar2 = buffer;
        buffer = pTVar2->nextAllocation;
        bVar3 = buffer != (TEmitBufferAllocation *)0x0;
        if (buffer == (TEmitBufferAllocation *)0x0) goto LAB_0040b3ec;
      } while (buffer->allocation->address != (char *)address);
    }
    pEVar1 = (EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
              *)&pTVar2->nextAllocation;
    if (pTVar2 == (TEmitBufferAllocation *)0x0) {
      pEVar1 = this;
    }
    pEVar1->allocations = buffer->nextAllocation;
    if ((this->scriptContext != (ScriptContext *)0x0) && (buffer->recorded == true)) {
      ThreadContext::SubCodeSize(this->scriptContext->threadContext,buffer->bytesCommitted);
    }
    ThreadContextInfo::SetValidCallTargetForCFG(this->threadContext,address,false);
    if (DAT_015d346a == '\x01') {
      Output::Trace(CustomHeapPhase,L"Freeing 0x%p, allocation: 0x%p\n",address,
                    buffer->allocation->address);
    }
    Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
    Free(&this->allocationHeap,buffer->allocation);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (&this->allocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,buffer,0x28
              );
  }
LAB_0040b3ec:
  CCLock::Leave(&(this->criticalSection).super_CCLock);
  return bVar3;
}

Assistant:

bool
EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::FreeAllocation(void* address)
{
#if PDATA_ENABLED && defined(_WIN32)
    DelayDeletingFunctionTable::Clear();
#endif

    AutoRealOrFakeCriticalSection<SyncObject> autoCs(&this->criticalSection);

#if _M_ARM
    address = (void*)((uintptr_t)address & ~0x1); // clear the thumb bit
#endif
    TEmitBufferAllocation* previous = nullptr;
    TEmitBufferAllocation* allocation = allocations;
    while(allocation != nullptr)
    {
        if (address == allocation->allocation->address)
        {
            if (previous == nullptr)
            {
                this->allocations = allocation->nextAllocation;
            }
            else
            {
                previous->nextAllocation = allocation->nextAllocation;
            }

            if ((scriptContext != nullptr) && allocation->recorded)
            {
                this->scriptContext->GetThreadContext()->SubCodeSize(allocation->bytesCommitted);
            }

#if defined(_CONTROL_FLOW_GUARD) && !defined(_M_ARM)
            if (allocation->allocation->thunkAddress)
            {
                if (JITManager::GetJITManager()->IsJITServer())
                {
                    ((ServerThreadContext*)this->threadContext)->GetJITThunkEmitter()->FreeThunk(allocation->allocation->thunkAddress);
                }
                else
                {
                    ((ThreadContext*)this->threadContext)->GetJITThunkEmitter()->FreeThunk(allocation->allocation->thunkAddress);
                }
            }
            else
#endif
            {
                SetValidCallTarget(allocation, address, false);
            }
            VerboseHeapTrace(_u("Freeing 0x%p, allocation: 0x%p\n"), address, allocation->allocation->address);

            this->allocationHeap.Free(allocation->allocation);
            this->allocator->Free(allocation, sizeof(TEmitBufferAllocation));

            return true;
        }
        previous = allocation;
        allocation = allocation->nextAllocation;
    }
    return false;
}